

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeForInOrForOf::ParseNodeForInOrForOf
          (ParseNodeForInOrForOf *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeForInOrForOf *this_local;
  
  ParseNodeStmt::ParseNodeStmt(&this->super_ParseNodeStmt,nop,ichMin,ichLim);
  return;
}

Assistant:

ParseNodeForInOrForOf::ParseNodeForInOrForOf(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeStmt(nop, ichMin, ichLim)
{
}